

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall
rlottie::internal::renderer::Composition::Composition
          (Composition *this,shared_ptr<rlottie::internal::model::Composition> *model)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Composition *__tmp;
  Layer *pLVar3;
  Layer *unaff_RBX;
  VArenaAlloc *unaff_R14;
  
  (this->mSurfaceCache).mCache.super__Vector_base<VBitmap,_std::allocator<VBitmap>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSurfaceCache).mCache.super__Vector_base<VBitmap,_std::allocator<VBitmap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSurfaceCache).mCache.super__Vector_base<VBitmap,_std::allocator<VBitmap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<VBitmap,_std::allocator<VBitmap>_>::reserve
            ((vector<VBitmap,_std::allocator<VBitmap>_> *)this,10);
  (this->mSurface).mImpl.mModel = (model *)0x0;
  (this->mScaleMatrix).m11 = 1.0;
  (this->mScaleMatrix).m12 = 0.0;
  (this->mScaleMatrix).m13 = 0.0;
  (this->mScaleMatrix).m21 = 0.0;
  (this->mScaleMatrix).m22 = 1.0;
  (this->mScaleMatrix).m23 = 0.0;
  (this->mScaleMatrix).mtx = 0.0;
  (this->mScaleMatrix).mty = 0.0;
  (this->mScaleMatrix).m33 = 1.0;
  (this->mScaleMatrix).mType = None;
  (this->mScaleMatrix).dirty = None;
  (this->mViewSize).mw = 0;
  (this->mViewSize).mh = 0;
  (this->mModel).
  super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mModel).
  super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->mRootLayer = (Layer *)0x0;
  VArenaAlloc::VArenaAlloc(&this->mAllocator,(char *)0x0,0,0x800);
  this->mCurFrameNo = -1;
  this->mKeepAspectRatio = true;
  this->mHasDynamicValue = false;
  peVar1 = (model->
           super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (model->
           super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (model->super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  (model->super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mModel).
  super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  this_00 = (this->mModel).
            super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->mModel).
  super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pLVar3 = createLayerItem(unaff_RBX,unaff_R14);
  this->mRootLayer = pLVar3;
  pLVar3->mComplexContent = false;
  this->mViewSize =
       ((this->mModel).
        super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->mSize;
  return;
}

Assistant:

renderer::Composition::Composition(std::shared_ptr<model::Composition> model)
    : mCurFrameNo(-1)
{
    mModel = std::move(model);
    mRootLayer = createLayerItem(mModel->mRootLayer, &mAllocator);
    mRootLayer->setComplexContent(false);
    mViewSize = mModel->size();
}